

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void todense<float,long>(size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                        long *Xc_indptr,double *buffer_arr)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  long *plVar3;
  unsigned_long *__first;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar4;
  long in_stack_00000008;
  size_t *row;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  double *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  ulong *local_68;
  long *in_stack_ffffffffffffffa0;
  unsigned_long *__val;
  unsigned_long *__last;
  
  std::fill<double*,double>
            ((double *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,(double *)0x53406a);
  __first = *(unsigned_long **)(in_stack_00000008 + in_RCX * 8);
  puVar1 = *(unsigned_long **)(in_stack_00000008 + 8 + in_RCX * 8);
  puVar2 = (unsigned_long *)((long)puVar1 + -1);
  __last = *(unsigned_long **)(in_R9 + (long)puVar2 * 8);
  local_68 = std::lower_bound<unsigned_long_const*,long>(__first,__last,in_stack_ffffffffffffffa0);
  __val = local_68;
  while( true ) {
    while( true ) {
      bVar4 = false;
      if ((local_68 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar4 = false, __first != puVar1)) {
        bVar4 = (unsigned_long *)*local_68 <= __last;
      }
      if (!bVar4) {
        return;
      }
      if (*(ulong *)(in_R9 + (long)__first * 8) == *local_68) break;
      if ((long)*local_68 < *(long *)(in_R9 + (long)__first * 8)) {
        local_68 = std::lower_bound<unsigned_long_const*,long>(__first,__last,(long *)__val);
      }
      else {
        plVar3 = std::lower_bound<long_const*,unsigned_long>((long *)__first,(long *)__last,__val);
        __first = (unsigned_long *)((long)plVar3 - in_R9 >> 3);
      }
    }
    row[(long)local_68 - (in_RDI + in_RSI * 8) >> 3] =
         (size_t)(double)*(float *)(in_R8 + (long)__first * 4);
    if (local_68 == (ulong *)(in_RDI + in_RDX * 8)) {
      return;
    }
    if (__first == puVar2) break;
    local_68 = local_68 + 1;
    plVar3 = std::lower_bound<long_const*,unsigned_long>((long *)__first,(long *)__last,__val);
    __first = (unsigned_long *)((long)plVar3 - in_R9 >> 3);
  }
  return;
}

Assistant:

void todense(const size_t *restrict ix_arr, size_t st, size_t end,
             size_t col_num,
             const real_t *restrict Xc,
             const sparse_ix *restrict Xc_ind,
             const sparse_ix *restrict Xc_indptr,
             double *restrict buffer_arr)
{
    std::fill(buffer_arr, buffer_arr + (end - st + 1), (double)0);

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    const size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    for (const size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            buffer_arr[row - (ix_arr + st)] = Xc[curr_pos];
            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }
}